

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_rangeproof_info
              (secp256k1_context *ctx,int *exp,int *mantissa,uint64_t *min_value,uint64_t *max_value
              ,uchar *proof,size_t plen)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  if (proof == (uchar *)0x0) {
    secp256k1_rangeproof_info_cold_1();
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    if ((0x40 < plen) && (bVar1 = *proof, iVar6 = 0, -1 < (char)bVar1)) {
      *exp = -1;
      *mantissa = 0;
      if (bVar1 < 0x40) {
        lVar3 = 1;
        uVar4 = 0;
      }
      else {
        bVar2 = *proof;
        *exp = bVar2 & 0x1f;
        if (0x12 < (byte)(bVar2 & 0x1f)) {
          return 0;
        }
        bVar2 = proof[1];
        *mantissa = bVar2 + 1;
        if (0x3f < bVar2) {
          return 0;
        }
        uVar4 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
        lVar3 = 2;
      }
      *max_value = uVar4;
      iVar6 = *exp;
      if (0 < iVar6) {
        do {
          if (0x1999999999999999 < uVar4) {
            return 0;
          }
          uVar4 = uVar4 * 10;
          *max_value = uVar4;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      *min_value = 0;
      iVar6 = 0;
      if ((bVar1 & 0x20) == 0) {
        uVar4 = 0;
      }
      else {
        if (plen - lVar3 < 8) {
          return 0;
        }
        uVar4 = 0;
        lVar5 = 0;
        do {
          uVar4 = uVar4 << 8 | (ulong)proof[lVar5 + lVar3];
          *min_value = uVar4;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
      }
      if (!CARRY8(uVar4,*max_value)) {
        *max_value = uVar4 + *max_value;
        iVar6 = 1;
      }
    }
  }
  return iVar6;
}

Assistant:

int secp256k1_rangeproof_info(const secp256k1_context* ctx, int *exp, int *mantissa,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    size_t offset;
    uint64_t scale;
    ARG_CHECK(exp != NULL);
    ARG_CHECK(mantissa != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(proof != NULL);
    offset = 0;
    scale = 1;
    (void)ctx;
    return secp256k1_rangeproof_getheader_impl(&offset, exp, mantissa, &scale, min_value, max_value, proof, plen);
}